

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

pair<int,_int> Utils::FindMax(Matrix *m,int start)

{
  Matrix *pMVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  pair<int,_int> local_40 [2];
  double curr;
  int j;
  int i;
  double max;
  int n;
  int start_local;
  Matrix *m_local;
  pair<int,_int> indexes;
  
  max._4_4_ = start;
  _n = m;
  max._0_4_ = Matrix::GetCols(m);
  pMVar1 = _n;
  Matrix::operator()(_n,max._4_4_,max._4_4_);
  std::abs((int)pMVar1);
  _j = extraout_XMM0_Qa;
  std::pair<int,_int>::pair<int_&,_int_&,_true>
            ((pair<int,_int> *)&m_local,(int *)((long)&max + 4),(int *)((long)&max + 4));
  for (curr._4_4_ = max._4_4_; curr._4_4_ < max._0_4_; curr._4_4_ = curr._4_4_ + 1) {
    for (curr._0_4_ = max._4_4_; curr._0_4_ < max._0_4_; curr._0_4_ = curr._0_4_ + 1) {
      pMVar1 = _n;
      Matrix::operator()(_n,curr._4_4_,curr._0_4_);
      std::abs((int)pMVar1);
      if (_j < extraout_XMM0_Qa_00) {
        _j = extraout_XMM0_Qa_00;
        std::pair<int,_int>::pair<int_&,_int_&,_true>
                  (local_40,(int *)((long)&curr + 4),(int *)&curr);
        std::pair<int,_int>::operator=((pair<int,_int> *)&m_local,local_40);
      }
    }
  }
  return (pair<int,_int>)m_local;
}

Assistant:

std::pair<int, int> Utils::FindMax(const Matrix& m, int start)
{
    const int n = m.GetCols();
    double max = std::abs(m(start, start));
    std::pair<int, int> indexes = {start, start};

    for (int i = start; i < n; ++i)
    {
        for (int j = start; j < n; ++j)
        {
            const double curr = std::abs(m(i, j));
            if (curr > max)
            {
                max = curr;
                indexes = {i, j};
            }
        }
    }
    return indexes;
}